

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O1

void tcmalloc_backtrace_qsort
               (void *basearg,size_t count,size_t size,_func_int_void_ptr_void_ptr *compar)

{
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong count_00;
  undefined1 *puVar6;
  undefined1 *local_38;
  
  local_38 = (undefined1 *)basearg;
  if (1 < count) {
    do {
      while( true ) {
        if (size != 0) {
          lVar3 = (count >> 1) * size;
          sVar4 = size;
          puVar6 = local_38;
          do {
            uVar1 = *puVar6;
            *puVar6 = puVar6[lVar3];
            puVar6[lVar3] = uVar1;
            puVar6 = puVar6 + 1;
            sVar4 = sVar4 - 1;
          } while (sVar4 != 0);
        }
        if (count < 2) {
          count_00 = 0;
        }
        else {
          uVar5 = 1;
          count_00 = 0;
          puVar6 = local_38;
          do {
            puVar6 = puVar6 + size;
            iVar2 = (*compar)(local_38,local_38 + uVar5 * size);
            if ((0 < iVar2) && (count_00 = count_00 + 1, uVar5 != count_00 && size != 0)) {
              sVar4 = 0;
              do {
                uVar1 = local_38[sVar4 + count_00 * size];
                local_38[sVar4 + count_00 * size] = puVar6[sVar4];
                puVar6[sVar4] = uVar1;
                sVar4 = sVar4 + 1;
              } while (sVar4 != size);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != count);
        }
        if (count_00 != 0 && size != 0) {
          sVar4 = size;
          puVar6 = local_38;
          do {
            uVar1 = *puVar6;
            *puVar6 = puVar6[count_00 * size];
            puVar6[count_00 * size] = uVar1;
            puVar6 = puVar6 + 1;
            sVar4 = sVar4 - 1;
          } while (sVar4 != 0);
        }
        if (count_00 * 2 < count) break;
        tcmalloc_backtrace_qsort
                  (local_38 + (count_00 + 1) * size,count - (count_00 + 1),size,compar);
        count = count_00;
        if (count_00 < 2) {
          return;
        }
      }
      tcmalloc_backtrace_qsort(local_38,count_00,size,compar);
      count = count - (count_00 + 1);
      local_38 = local_38 + (count_00 + 1) * size;
    } while (1 < count);
  }
  return;
}

Assistant:

void
backtrace_qsort (void *basearg, size_t count, size_t size,
		 int (*compar) (const void *, const void *))
{
  char *base = (char *) basearg;
  size_t i;
  size_t mid;

 tail_recurse:
  if (count < 2)
    return;

  /* The symbol table and DWARF tables, which is all we use this
     routine for, tend to be roughly sorted.  Pick the middle element
     in the array as our pivot point, so that we are more likely to
     cut the array in half for each recursion step.  */
  swap (base, base + (count / 2) * size, size);

  mid = 0;
  for (i = 1; i < count; i++)
    {
      if ((*compar) (base, base + i * size) > 0)
	{
	  ++mid;
	  if (i != mid)
	    swap (base + mid * size, base + i * size, size);
	}
    }

  if (mid > 0)
    swap (base, base + mid * size, size);

  /* Recurse with the smaller array, loop with the larger one.  That
     ensures that our maximum stack depth is log count.  */
  if (2 * mid < count)
    {
      backtrace_qsort (base, mid, size, compar);
      base += (mid + 1) * size;
      count -= mid + 1;
      goto tail_recurse;
    }
  else
    {
      backtrace_qsort (base + (mid + 1) * size, count - (mid + 1),
		       size, compar);
      count = mid;
      goto tail_recurse;
    }
}